

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  Parser *this;
  Opt *pOVar2;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  anon_class_1_0_00000001_for_m_lambda local_401;
  Opt local_400;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  allocator<char> local_331;
  string local_330;
  anon_class_1_0_00000001_for_m_lambda local_309;
  Opt local_308;
  Parser local_290;
  undefined1 local_230 [8];
  Parser newCli;
  Parser *cli;
  undefined1 local_1b8 [8];
  Session session;
  string quickfixConfigFile;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string((string *)&session.m_startupExceptions);
  Catch::Session::Session((Session *)local_1b8);
  this = Catch::Session::cli((Session *)local_1b8);
  newCli.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"user",&local_331);
  Catch::Clara::Opt::Opt<main::__0,void>(&local_308,&local_309,&local_330);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"--quickfix-config-file",&local_359);
  pOVar2 = Catch::Clara::Opt::operator[](&local_308,&local_358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"QuickFIX config file for tests",&local_381);
  pOVar2 = Catch::Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,&local_380);
  Catch::Clara::Parser::operator|(&local_290,this,pOVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"user",&local_429);
  Catch::Clara::Opt::Opt<main::__1,void>(&local_400,&local_401,&local_428);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"--quickfix-spec-path",&local_451);
  pOVar2 = Catch::Clara::Opt::operator[](&local_400,&local_450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"QuickFIX spec path",&local_479);
  pOVar2 = Catch::Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,&local_478);
  Catch::Clara::Parser::operator|((Parser *)local_230,&local_290,pOVar2);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  Catch::Clara::Opt::~Opt(&local_400);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  Catch::Clara::Parser::~Parser(&local_290);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  Catch::Clara::Opt::~Opt(&local_308);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  Catch::Session::cli((Session *)local_1b8,(Parser *)local_230);
  iVar1 = Catch::Session::run<char>((Session *)local_1b8,argc,argv);
  Catch::Clara::Parser::~Parser((Parser *)local_230);
  Catch::Session::~Session((Session *)local_1b8);
  std::__cxx11::string::~string((string *)&session.m_startupExceptions);
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
  std::string quickfixConfigFile;

  Catch::Session session;
  auto &cli = session.cli();
  auto newCli = cli
                | Catch::Clara::Opt(
                    [](std::string quickfixConfigFile) {
                      FIX::TestSettings::sessionSettings = FIX::SessionSettings(quickfixConfigFile);
                    },
                    "user")["--quickfix-config-file"]("QuickFIX config file for tests")
                | Catch::Clara::Opt(
                    [](std::string quickfixSpecPath) { FIX::TestSettings::specPath = quickfixSpecPath; },
                    "user")["--quickfix-spec-path"]("QuickFIX spec path");
  session.cli(newCli);

  return session.run(argc, argv);
}